

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  stbi__uint32 *y_00;
  int *comp_00;
  anon_struct_96_18_0d0905d3 *paVar1;
  uchar uVar2;
  short sVar3;
  undefined8 uVar4;
  short sVar5;
  bool bVar6;
  stbi_uc sVar7;
  stbi_uc sVar8;
  byte bVar9;
  byte bVar10;
  int iVar11;
  stbi__uint32 sVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  void *pvVar18;
  stbi__jpeg *psVar19;
  stbi__uint16 *psVar20;
  uchar *puVar21;
  code *pcVar22;
  stbi_uc *psVar23;
  stbi_uc *psVar24;
  uint uVar25;
  long lVar26;
  short sVar27;
  uint uVar28;
  int iVar29;
  ulong uVar30;
  stbi__context *psVar31;
  int id;
  byte *pbVar32;
  long lVar33;
  int iVar34;
  anon_struct_96_18_0d0905d3 *paVar35;
  int iVar36;
  ulong uVar37;
  stbi__uint32 sVar38;
  int iVar39;
  short *psVar40;
  stbi_uc **ppsVar41;
  bool bVar42;
  uint local_508;
  uint local_4e0;
  uint local_4d0;
  uint local_4b0;
  uint local_4ac;
  uint local_49c;
  stbi_uc *coutput [4];
  int local_478;
  uint local_468;
  uint local_45c;
  stbi_uc pal [256] [4];
  
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  iVar14 = req_comp;
  iVar11 = stbi__check_png_header(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar11 != 0) {
    if (4 < (uint)req_comp) {
      stbi__g_failure_reason = "bad req_comp";
      return (void *)0x0;
    }
    pal._0_8_ = s;
    iVar14 = stbi__parse_png_file((stbi__png *)pal,0,req_comp);
    uVar4 = pal._0_8_;
    if (iVar14 == 0) {
      psVar20 = (stbi__uint16 *)0x0;
    }
    else {
      if ((int)pal[8] < 9) {
        iVar14 = 8;
      }
      else {
        if (pal[8] != (stbi_uc  [4])0x10) {
          stbi__g_failure_reason = "bad bits_per_channel";
          return (void *)0x0;
        }
        iVar14 = 0x10;
      }
      ri->bits_per_channel = iVar14;
      psVar20 = (stbi__uint16 *)pal._24_8_;
      if ((req_comp != 0) && (iVar14 = *(int *)(pal._0_8_ + 0xc), iVar14 != req_comp)) {
        if ((int)pal[8] < 9) {
          psVar20 = (stbi__uint16 *)
                    stbi__convert_format
                              ((uchar *)pal._24_8_,iVar14,req_comp,*(uint *)pal._0_8_,
                               *(uint *)(pal._0_8_ + 4));
        }
        else {
          psVar20 = stbi__convert_format16
                              ((stbi__uint16 *)pal._24_8_,iVar14,req_comp,*(uint *)pal._0_8_,
                               *(uint *)(pal._0_8_ + 4));
        }
        *(int *)(uVar4 + 0xc) = req_comp;
        if (psVar20 == (stbi__uint16 *)0x0) {
          return (void *)0x0;
        }
      }
      *x = *(int *)uVar4;
      *y = *(int *)(uVar4 + 4);
      if (comp != (int *)0x0) {
        *comp = *(int *)(uVar4 + 8);
      }
      pal._24_8_ = (void *)0x0;
    }
    free((void *)pal._24_8_);
    free((void *)pal._16_8_);
    psVar19 = (stbi__jpeg *)pal._8_8_;
    goto LAB_0016e2a7;
  }
  sVar7 = stbi__get8(s);
  if ((sVar7 == 'B') && (sVar7 = stbi__get8(s), sVar7 == 'M')) {
    stbi__get32le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get32le(s);
    sVar12 = stbi__get32le(s);
    if (((sVar12 < 0x39) && ((0x100010000001000U >> ((ulong)sVar12 & 0x3f) & 1) != 0)) ||
       ((sVar12 == 0x7c || (sVar12 == 0x6c)))) {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      coutput[3] = (stbi_uc *)CONCAT44(0xff,(uint)coutput[3]);
      pvVar18 = stbi__bmp_parse_header(s,(stbi__bmp_data *)coutput);
      if (pvVar18 == (void *)0x0) {
        return (void *)0x0;
      }
      uVar25 = s->img_y;
      uVar28 = -uVar25;
      if (0 < (int)uVar25) {
        uVar28 = uVar25;
      }
      s->img_y = uVar28;
      if ((0x1000000 < uVar28) || (0x1000000 < s->img_x)) goto LAB_0016d729;
      uVar28 = (uint)coutput[3];
      local_508 = coutput[3]._4_4_;
      if ((int)coutput[1] == 0xc) {
        if (0x17 < (int)coutput[0]) goto LAB_0016d748;
        uVar13 = ((coutput[0]._4_4_ - local_478) + -0x18) / 3;
LAB_0016d667:
        if (uVar13 == 0) goto LAB_0016d748;
        bVar6 = false;
LAB_0016d695:
        bVar42 = uVar28 == 0xff000000;
        iVar14 = 4 - (uint)(uVar28 == 0);
        iVar11 = (int)coutput[0];
      }
      else {
        if ((int)coutput[0] < 0x10) {
          uVar13 = coutput[0]._4_4_ - (local_478 + (int)coutput[1]) >> 2;
          goto LAB_0016d667;
        }
LAB_0016d748:
        iVar14 = (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original) +
                 s->callback_already_read;
        if (iVar14 - 0x401U < 0xfffffc00) {
          stbi__g_failure_reason = "bad header";
          return (void *)0x0;
        }
        if ((coutput[0]._4_4_ < iVar14) || (0x400 < coutput[0]._4_4_ - iVar14)) {
          stbi__g_failure_reason = "bad offset";
          return (void *)0x0;
        }
        stbi__skip(s,coutput[0]._4_4_ - iVar14);
        uVar13 = 0;
        bVar42 = true;
        bVar6 = true;
        if ((int)coutput[0] != 0x18 || uVar28 != 0xff000000) goto LAB_0016d695;
        iVar14 = 3;
        iVar11 = 0x18;
        bVar6 = true;
      }
      s->img_n = iVar14;
      if (2 < req_comp) {
        iVar14 = req_comp;
      }
      sVar12 = s->img_x;
      sVar38 = s->img_y;
      iVar15 = stbi__mad3sizes_valid(iVar14,sVar12,sVar38,0);
      if (iVar15 == 0) goto LAB_0016d729;
      puVar21 = (uchar *)stbi__malloc_mad3(iVar14,sVar12,sVar38,0);
      if (puVar21 == (uchar *)0x0) goto LAB_0016d732;
      if (iVar11 < 0x10) {
        if (bVar6 || 0x100 < (int)uVar13) {
          free(puVar21);
          stbi__g_failure_reason = "invalid";
          return (void *)0x0;
        }
        uVar30 = 0;
        uVar37 = 0;
        if (0 < (int)uVar13) {
          uVar37 = (ulong)uVar13;
        }
        for (; uVar37 != uVar30; uVar30 = uVar30 + 1) {
          sVar7 = stbi__get8(s);
          pal[uVar30][2] = sVar7;
          sVar7 = stbi__get8(s);
          pal[uVar30][1] = sVar7;
          sVar7 = stbi__get8(s);
          pal[uVar30][0] = sVar7;
          if ((int)coutput[1] != 0xc) {
            stbi__get8(s);
          }
          pal[uVar30][3] = 0xff;
        }
        stbi__skip(s,(uVar13 * ((int)coutput[1] == 0xc | 0xfffffffc) + coutput[0]._4_4_) -
                     ((int)coutput[1] + local_478));
        if (iVar11 == 1) {
          local_4e0 = -(s->img_x + 7 >> 3) & 3;
          iVar11 = 0;
          uVar30 = 0;
LAB_0016e7cd:
          sVar12 = s->img_y;
          if (iVar11 < (int)sVar12) {
            iVar15 = 0;
            do {
              bVar10 = stbi__get8(s);
              sVar12 = s->img_x;
              iVar29 = 8;
              do {
                if ((int)sVar12 <= iVar15) {
LAB_0016e85b:
                  uVar30 = uVar30 & 0xffffffff;
                  stbi__skip(s,local_4e0);
                  iVar11 = iVar11 + 1;
                  goto LAB_0016e7cd;
                }
                bVar42 = (bVar10 >> (iVar29 - 1U & 0x1f) & 1) != 0;
                iVar34 = (int)uVar30;
                lVar26 = (long)iVar34;
                uVar30 = lVar26 + 3;
                puVar21[lVar26] = pal[bVar42][0];
                puVar21[lVar26 + 1] = pal[bVar42][1];
                puVar21[lVar26 + 2] = pal[bVar42][2];
                if (iVar14 == 4) {
                  puVar21[uVar30] = 0xff;
                  uVar30 = (ulong)(iVar34 + 4);
                }
                if (sVar12 - 1 == iVar15) goto LAB_0016e85b;
                iVar15 = iVar15 + 1;
                iVar34 = iVar29 + -1;
                bVar42 = 0 < iVar29;
                iVar29 = iVar34;
              } while (iVar34 != 0 && bVar42);
            } while( true );
          }
        }
        else {
          if (iVar11 == 8) {
            uVar28 = s->img_x;
          }
          else {
            if (iVar11 != 4) {
              free(puVar21);
              stbi__g_failure_reason = "bad bpp";
              return (void *)0x0;
            }
            uVar28 = s->img_x + 1 >> 1;
          }
          uVar30 = 0;
          local_4d0 = -uVar28 & 3;
          for (iVar15 = 0; sVar12 = s->img_y, iVar15 < (int)sVar12; iVar15 = iVar15 + 1) {
            for (iVar29 = 0; iVar29 < (int)s->img_x; iVar29 = iVar29 + 2) {
              bVar10 = stbi__get8(s);
              uVar13 = bVar10 & 0xf;
              uVar28 = (uint)(bVar10 >> 4);
              if (iVar11 != 4) {
                uVar28 = (uint)bVar10;
              }
              if (iVar11 != 4) {
                uVar13 = 0;
              }
              lVar26 = (long)(int)uVar30;
              uVar37 = lVar26 + 3;
              puVar21[lVar26] = pal[uVar28][0];
              puVar21[lVar26 + 1] = pal[uVar28][1];
              puVar21[lVar26 + 2] = pal[uVar28][2];
              if (iVar14 == 4) {
                puVar21[uVar37] = 0xff;
                uVar37 = (ulong)((int)uVar30 + 4);
              }
              if (iVar29 + 1U == s->img_x) {
                uVar30 = uVar37 & 0xffffffff;
                break;
              }
              if (iVar11 == 8) {
                bVar10 = stbi__get8(s);
                uVar13 = (uint)bVar10;
              }
              lVar26 = (long)(int)uVar37;
              uVar30 = lVar26 + 3;
              puVar21[lVar26] = pal[uVar13][0];
              puVar21[lVar26 + 1] = pal[uVar13][1];
              puVar21[lVar26 + 2] = pal[uVar13][2];
              if (iVar14 == 4) {
                puVar21[uVar30] = 0xff;
                uVar30 = (ulong)((int)uVar37 + 4);
              }
            }
            stbi__skip(s,local_4d0);
          }
        }
        goto LAB_0016e87e;
      }
      stbi__skip(s,coutput[0]._4_4_ - ((int)coutput[1] + local_478));
      if (iVar11 == 0x10) {
        local_49c = s->img_x * 2 & 2;
LAB_0016e399:
        if (((uint)coutput[2] == 0 || coutput[1]._4_4_ == 0) || coutput[2]._4_4_ == 0) {
LAB_0016e460:
          free(puVar21);
          stbi__g_failure_reason = "bad masks";
          return (void *)0x0;
        }
        iVar15 = stbi__high_bit(coutput[1]._4_4_);
        local_4ac = stbi__bitcount(coutput[1]._4_4_);
        iVar16 = stbi__high_bit((uint)coutput[2]);
        local_4b0 = stbi__bitcount((uint)coutput[2]);
        iVar29 = stbi__high_bit(coutput[2]._4_4_);
        local_45c = stbi__bitcount(coutput[2]._4_4_);
        iVar34 = stbi__high_bit(uVar28);
        local_468 = stbi__bitcount(uVar28);
        if ((8 < local_45c || (8 < local_4b0 || 8 < local_4ac)) || 8 < local_468) goto LAB_0016e460;
        iVar15 = iVar15 + -7;
        iVar16 = iVar16 + -7;
        iVar29 = iVar29 + -7;
        iVar34 = iVar34 + -7;
        bVar6 = true;
        bVar42 = false;
      }
      else {
        if (iVar11 == 0x20) {
          local_49c = 0;
          if (!(bool)((coutput[1]._4_4_ == 0xff0000 &&
                      ((uint)coutput[2] == 0xff00 && coutput[2]._4_4_ == 0xff)) & bVar42))
          goto LAB_0016e399;
          bVar42 = true;
        }
        else {
          local_49c = 0;
          if (iVar11 != 0x18) goto LAB_0016e399;
          local_49c = s->img_x & 3;
          bVar42 = false;
        }
        bVar6 = false;
        iVar15 = 0;
        iVar16 = 0;
        iVar29 = 0;
        iVar34 = 0;
        local_4ac = 0;
        local_4b0 = 0;
        local_45c = 0;
        local_468 = 0;
      }
      uVar30 = 0;
      for (iVar39 = 0; sVar12 = s->img_y, iVar39 < (int)sVar12; iVar39 = iVar39 + 1) {
        if (bVar6) {
          for (iVar36 = 0; iVar36 < (int)s->img_x; iVar36 = iVar36 + 1) {
            if (iVar11 == 0x10) {
              uVar13 = stbi__get16le(s);
            }
            else {
              uVar13 = stbi__get32le(s);
            }
            iVar17 = stbi__shiftsigned(uVar13 & coutput[1]._4_4_,iVar15,local_4ac);
            lVar26 = (long)(int)uVar30;
            puVar21[lVar26] = (uchar)iVar17;
            iVar17 = stbi__shiftsigned(uVar13 & (uint)coutput[2],iVar16,local_4b0);
            puVar21[lVar26 + 1] = (uchar)iVar17;
            iVar17 = stbi__shiftsigned(uVar13 & coutput[2]._4_4_,iVar29,local_45c);
            puVar21[lVar26 + 2] = (uchar)iVar17;
            if (uVar28 == 0) {
              uVar13 = 0xff;
            }
            else {
              uVar13 = stbi__shiftsigned(uVar13 & uVar28,iVar34,local_468);
            }
            uVar37 = lVar26 + 3;
            if (iVar14 == 4) {
              puVar21[uVar37] = (uchar)uVar13;
              uVar37 = (ulong)((int)uVar30 + 4);
            }
            local_508 = local_508 | uVar13;
            uVar30 = uVar37 & 0xffffffff;
          }
        }
        else {
          for (iVar36 = 0; iVar36 < (int)s->img_x; iVar36 = iVar36 + 1) {
            sVar7 = stbi__get8(s);
            lVar26 = (long)(int)uVar30;
            puVar21[lVar26 + 2] = sVar7;
            sVar7 = stbi__get8(s);
            puVar21[lVar26 + 1] = sVar7;
            sVar7 = stbi__get8(s);
            puVar21[lVar26] = sVar7;
            bVar10 = 0xff;
            if (bVar42) {
              bVar10 = stbi__get8(s);
            }
            uVar37 = lVar26 + 3;
            if (iVar14 == 4) {
              puVar21[uVar37] = bVar10;
              uVar37 = (ulong)((int)uVar30 + 4);
            }
            local_508 = local_508 | bVar10;
            uVar30 = uVar37 & 0xffffffff;
          }
        }
        stbi__skip(s,local_49c);
      }
LAB_0016e87e:
      if ((iVar14 == 4) && (local_508 == 0)) {
        for (uVar28 = s->img_x * sVar12 * 4 - 1; -1 < (int)uVar28; uVar28 = uVar28 - 4) {
          puVar21[uVar28] = 0xff;
        }
      }
      if (0 < (int)uVar25) {
        iVar11 = (int)sVar12 >> 1;
        if ((int)sVar12 >> 1 < 1) {
          iVar11 = 0;
        }
        iVar29 = (sVar12 - 1) * iVar14;
        iVar15 = 0;
        for (iVar34 = 0; iVar34 != iVar11; iVar34 = iVar34 + 1) {
          sVar38 = s->img_x;
          uVar25 = sVar38 * iVar14;
          if ((int)(sVar38 * iVar14) < 1) {
            uVar25 = 0;
          }
          for (uVar30 = 0; uVar25 != uVar30; uVar30 = uVar30 + 1) {
            uVar2 = puVar21[uVar30 + sVar38 * iVar15];
            puVar21[uVar30 + sVar38 * iVar15] = puVar21[uVar30 + sVar38 * iVar29];
            puVar21[uVar30 + sVar38 * iVar29] = uVar2;
          }
          iVar29 = iVar29 - iVar14;
          iVar15 = iVar15 + iVar14;
        }
      }
      uVar25 = s->img_x;
      if ((req_comp != 0) && (iVar14 != req_comp)) {
        puVar21 = stbi__convert_format(puVar21,iVar14,req_comp,uVar25,sVar12);
        if (puVar21 == (uchar *)0x0) {
          return (void *)0x0;
        }
        uVar25 = s->img_x;
      }
      *x = uVar25;
      *y = s->img_y;
      if (comp != (int *)0x0) {
        *comp = s->img_n;
        return puVar21;
      }
      return puVar21;
    }
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  psVar19 = (stbi__jpeg *)calloc(1,0x4888);
  if (psVar19 == (stbi__jpeg *)0x0) {
    stbi__g_failure_reason = "outofmem";
  }
  else {
    psVar19->s = s;
    psVar19->idct_block_kernel = stbi__idct_simd;
    psVar19->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar19->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    iVar11 = stbi__decode_jpeg_header(psVar19,1);
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    free(psVar19);
    if (iVar11 != 0) {
      psVar19 = (stbi__jpeg *)calloc(1,0x4888);
      if (psVar19 == (stbi__jpeg *)0x0) goto LAB_0016d732;
      psVar19->s = s;
      psVar19->idct_block_kernel = stbi__idct_simd;
      psVar19->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
      psVar19->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
      s->img_n = 0;
      if ((uint)req_comp < 5) {
        for (lVar26 = 0x46d8; lVar26 != 0x4858; lVar26 = lVar26 + 0x60) {
          psVar24 = psVar19->huff_dc[0].fast + lVar26 + -8;
          psVar24[0] = '\0';
          psVar24[1] = '\0';
          psVar24[2] = '\0';
          psVar24[3] = '\0';
          psVar24[4] = '\0';
          psVar24[5] = '\0';
          psVar24[6] = '\0';
          psVar24[7] = '\0';
          psVar24[8] = '\0';
          psVar24[9] = '\0';
          psVar24[10] = '\0';
          psVar24[0xb] = '\0';
          psVar24[0xc] = '\0';
          psVar24[0xd] = '\0';
          psVar24[0xe] = '\0';
          psVar24[0xf] = '\0';
        }
        psVar19->restart_interval = 0;
        iVar14 = stbi__decode_jpeg_header(psVar19,0);
        if (iVar14 != 0) {
          paVar1 = psVar19->img_comp;
          bVar10 = stbi__get_marker(psVar19);
LAB_0016cabc:
          if (bVar10 == 0xda) {
            iVar14 = stbi__get16be(psVar19->s);
            bVar10 = stbi__get8(psVar19->s);
            uVar25 = (uint)bVar10;
            psVar19->scan_n = (uint)bVar10;
            if (((byte)(bVar10 - 5) < 0xfc) ||
               (psVar31 = psVar19->s, psVar31->img_n < (int)(uint)bVar10)) {
              stbi__g_failure_reason = "bad SOS component count";
              goto LAB_0016e297;
            }
            if (iVar14 != (uint)bVar10 * 2 + 6) {
              stbi__g_failure_reason = "bad SOS len";
              goto LAB_0016e297;
            }
            lVar26 = 0;
            while( true ) {
              bVar10 = stbi__get8(psVar31);
              if ((int)uVar25 <= lVar26) break;
              bVar9 = stbi__get8(psVar19->s);
              psVar31 = psVar19->s;
              uVar25 = psVar31->img_n;
              uVar30 = 0;
              if (0 < (int)uVar25) {
                uVar30 = (ulong)uVar25;
              }
              paVar35 = paVar1;
              for (uVar37 = 0; uVar30 != uVar37; uVar37 = uVar37 + 1) {
                if (paVar35->id == (uint)bVar10) {
                  uVar30 = uVar37 & 0xffffffff;
                  break;
                }
                paVar35 = paVar35 + 1;
              }
              if ((uint)uVar30 == uVar25) goto LAB_0016e297;
              psVar19->img_comp[uVar30].hd = (uint)(bVar9 >> 4);
              if (0x3f < bVar9) {
                stbi__g_failure_reason = "bad DC huff";
                goto LAB_0016e297;
              }
              paVar1[uVar30].ha = bVar9 & 0xf;
              if (3 < (bVar9 & 0xf)) {
                stbi__g_failure_reason = "bad AC huff";
                goto LAB_0016e297;
              }
              psVar19->order[lVar26] = (uint)uVar30;
              lVar26 = lVar26 + 1;
              uVar25 = psVar19->scan_n;
            }
            psVar19->spec_start = (uint)bVar10;
            bVar10 = stbi__get8(psVar19->s);
            psVar19->spec_end = (uint)bVar10;
            bVar10 = stbi__get8(psVar19->s);
            psVar19->succ_high = (uint)(bVar10 >> 4);
            psVar19->succ_low = bVar10 & 0xf;
            iVar14 = psVar19->spec_start;
            if (psVar19->progressive == 0) {
              if ((iVar14 != 0) || ((0xf < bVar10 || ((bVar10 & 0xf) != 0)))) {
LAB_0016e289:
                stbi__g_failure_reason = "bad SOS";
                goto LAB_0016e297;
              }
              psVar19->spec_end = 0x3f;
            }
            else if ((((0x3f < iVar14) || (0x3f < psVar19->spec_end)) ||
                     (psVar19->spec_end < iVar14)) || ((0xdf < bVar10 || (0xd < (bVar10 & 0xf)))))
            goto LAB_0016e289;
            stbi__jpeg_reset(psVar19);
            if (psVar19->progressive != 0) {
              if (psVar19->scan_n == 1) {
                iVar14 = psVar19->order[0];
                iVar15 = psVar19->img_comp[iVar14].x + 7 >> 3;
                iVar11 = psVar19->img_comp[iVar14].y + 7 >> 3;
                iVar29 = 0;
                if (iVar15 < 1) {
                  iVar15 = 0;
                }
                if (iVar11 < 1) {
                  iVar11 = iVar29;
                }
                for (; iVar29 != iVar11; iVar29 = iVar29 + 1) {
                  for (iVar34 = 0; iVar34 != iVar15; iVar34 = iVar34 + 1) {
                    psVar40 = paVar1[iVar14].coeff +
                              (paVar1[iVar14].coeff_w * iVar29 + iVar34) * 0x40;
                    uVar30 = (ulong)psVar19->spec_start;
                    if (uVar30 == 0) {
                      iVar16 = stbi__jpeg_decode_block_prog_dc
                                         (psVar19,psVar40,
                                          (stbi__huffman *)psVar19->huff_dc[paVar1[iVar14].hd].fast,
                                          iVar14);
                      if (iVar16 == 0) goto LAB_0016e297;
                    }
                    else {
                      iVar16 = paVar1[iVar14].ha;
                      psVar24 = psVar19->huff_ac[iVar16].fast;
                      iVar39 = psVar19->eob_run;
                      bVar10 = (byte)psVar19->succ_low;
                      if (psVar19->succ_high == 0) {
                        if (iVar39 == 0) {
                          do {
                            if (psVar19->code_bits < 0x10) {
                              stbi__grow_buffer_unsafe(psVar19);
                            }
                            sVar27 = psVar19->fast_ac[iVar16][psVar19->code_buffer >> 0x17];
                            uVar25 = (uint)sVar27;
                            iVar39 = (int)uVar30;
                            if (sVar27 == 0) {
                              uVar25 = stbi__jpeg_huff_decode(psVar19,(stbi__huffman *)psVar24);
                              if ((int)uVar25 < 0) goto LAB_0016d9dc;
                              uVar28 = uVar25 >> 4;
                              if ((uVar25 & 0xf) == 0) {
                                if (uVar25 < 0xf0) {
                                  iVar39 = 1 << ((byte)uVar28 & 0x1f);
                                  psVar19->eob_run = iVar39;
                                  if (0xf < uVar25) {
                                    iVar39 = stbi__jpeg_get_bits(psVar19,uVar28);
                                    iVar39 = iVar39 + psVar19->eob_run;
                                  }
                                  goto LAB_0016ce5c;
                                }
                                uVar30 = (ulong)(iVar39 + 0x10);
                              }
                              else {
                                lVar26 = (ulong)uVar28 + (long)iVar39;
                                uVar30 = (ulong)((int)lVar26 + 1);
                                bVar9 = ""[lVar26];
                                iVar39 = stbi__extend_receive(psVar19,uVar25 & 0xf);
                                psVar40[bVar9] = (short)(iVar39 << (bVar10 & 0x1f));
                              }
                            }
                            else {
                              uVar28 = uVar25 & 0xf;
                              if (psVar19->code_bits < (int)uVar28) goto LAB_0016db83;
                              lVar26 = (ulong)(uVar25 >> 4 & 0xf) + (long)iVar39;
                              psVar19->code_buffer = psVar19->code_buffer << (sbyte)uVar28;
                              psVar19->code_bits = psVar19->code_bits - uVar28;
                              uVar30 = (ulong)((int)lVar26 + 1);
                              psVar40[""[lVar26]] = (short)((uVar25 >> 8) << (bVar10 & 0x1f));
                            }
                          } while ((int)uVar30 <= psVar19->spec_end);
                        }
                        else {
LAB_0016ce5c:
                          psVar19->eob_run = iVar39 + -1;
                        }
                      }
                      else if (iVar39 == 0) {
                        iVar16 = 0x10000 << (bVar10 & 0x1f);
                        do {
                          uVar25 = stbi__jpeg_huff_decode(psVar19,(stbi__huffman *)psVar24);
                          if ((int)uVar25 < 0) goto LAB_0016d9dc;
                          uVar28 = uVar25 >> 4;
                          if ((uVar25 & 0xf) == 1) {
                            iVar39 = stbi__jpeg_get_bit(psVar19);
                            iVar36 = 1;
                            if (iVar39 == 0) {
                              iVar36 = 0xffff;
                            }
                            sVar27 = (short)(iVar36 << (bVar10 & 0x1f));
                          }
                          else {
                            if ((uVar25 & 0xf) != 0) goto LAB_0016db83;
                            if (uVar25 < 0xf0) {
                              psVar19->eob_run = ~(-1 << ((byte)uVar28 & 0x1f));
                              if (0xf < uVar25) {
                                iVar39 = stbi__jpeg_get_bits(psVar19,uVar28);
                                psVar19->eob_run = psVar19->eob_run + iVar39;
                              }
                              uVar28 = 0x40;
                            }
                            else {
                              uVar28 = 0xf;
                            }
                            sVar27 = 0;
                          }
                          uVar37 = (long)(int)uVar30;
                          do {
                            while( true ) {
                              uVar30 = uVar37;
                              iVar39 = psVar19->spec_end;
                              if ((long)iVar39 < (long)uVar30) goto LAB_0016cf8c;
                              bVar9 = ""[uVar30];
                              if (psVar40[bVar9] == 0) break;
                              iVar39 = stbi__jpeg_get_bit(psVar19);
                              if ((iVar39 != 0) &&
                                 (sVar3 = psVar40[bVar9], (iVar16 >> 0x10 & (int)sVar3) == 0)) {
                                sVar5 = (short)((uint)iVar16 >> 0x10);
                                if (sVar3 < 1) {
                                  sVar5 = -sVar5;
                                }
                                psVar40[bVar9] = sVar3 + sVar5;
                              }
                              uVar37 = uVar30 + 1;
                            }
                            bVar42 = uVar28 != 0;
                            uVar28 = uVar28 - 1;
                            uVar37 = uVar30 + 1;
                          } while (bVar42);
                          psVar40[bVar9] = sVar27;
                          uVar30 = uVar30 + 1;
LAB_0016cf8c:
                        } while ((int)uVar30 <= iVar39);
                      }
                      else {
                        psVar19->eob_run = iVar39 + -1;
                        uVar25 = (0x10000 << (bVar10 & 0x1f)) >> 0x10;
                        for (; (long)uVar30 <= (long)psVar19->spec_end; uVar30 = uVar30 + 1) {
                          bVar10 = ""[uVar30];
                          if (((psVar40[bVar10] != 0) &&
                              (iVar16 = stbi__jpeg_get_bit(psVar19), iVar16 != 0)) &&
                             (sVar27 = psVar40[bVar10], (uVar25 & (int)sVar27) == 0)) {
                            uVar28 = -uVar25;
                            if (0 < sVar27) {
                              uVar28 = uVar25;
                            }
                            psVar40[bVar10] = (short)uVar28 + sVar27;
                          }
                        }
                      }
                    }
                    iVar16 = psVar19->todo;
                    psVar19->todo = iVar16 + -1;
                    if (iVar16 < 2) {
                      if (psVar19->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar19);
                      }
                      bVar10 = psVar19->marker;
                      if ((bVar10 & 0xf8) != 0xd0) goto LAB_0016d568;
                      stbi__jpeg_reset(psVar19);
                    }
                  }
                }
              }
              else {
                for (iVar14 = 0; iVar14 < psVar19->img_mcu_y; iVar14 = iVar14 + 1) {
                  for (iVar11 = 0; iVar11 < psVar19->img_mcu_x; iVar11 = iVar11 + 1) {
                    for (lVar26 = 0; lVar26 < psVar19->scan_n; lVar26 = lVar26 + 1) {
                      iVar15 = psVar19->order[lVar26];
                      for (iVar29 = 0; iVar29 < paVar1[iVar15].v; iVar29 = iVar29 + 1) {
                        iVar34 = 0;
                        while (iVar34 < paVar1[iVar15].h) {
                          iVar16 = stbi__jpeg_decode_block_prog_dc
                                             (psVar19,paVar1[iVar15].coeff +
                                                      (paVar1[iVar15].h * iVar11 + iVar34 +
                                                      (paVar1[iVar15].v * iVar14 + iVar29) *
                                                      paVar1[iVar15].coeff_w) * 0x40,
                                              (stbi__huffman *)
                                              psVar19->huff_dc[paVar1[iVar15].hd].fast,iVar15);
                          iVar34 = iVar34 + 1;
                          if (iVar16 == 0) goto LAB_0016e297;
                        }
                      }
                    }
                    iVar15 = psVar19->todo;
                    psVar19->todo = iVar15 + -1;
                    if (iVar15 < 2) {
                      if (psVar19->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar19);
                      }
                      bVar10 = psVar19->marker;
                      if ((bVar10 & 0xf8) != 0xd0) goto LAB_0016d568;
                      stbi__jpeg_reset(psVar19);
                    }
                  }
                }
              }
              goto LAB_0016d561;
            }
            if (psVar19->scan_n == 1) {
              iVar14 = psVar19->order[0];
              uVar25 = psVar19->img_comp[iVar14].x + 7 >> 3;
              iVar11 = psVar19->img_comp[iVar14].y + 7 >> 3;
              if ((int)uVar25 < 1) {
                uVar25 = 0;
              }
              iVar15 = 0;
              if (iVar11 < 1) {
                iVar11 = 0;
              }
              for (iVar29 = 0; iVar29 != iVar11; iVar29 = iVar29 + 1) {
                for (lVar26 = 0; (ulong)uVar25 * 8 != lVar26; lVar26 = lVar26 + 8) {
                  iVar34 = stbi__jpeg_decode_block
                                     (psVar19,(short *)pal,
                                      (stbi__huffman *)psVar19->huff_dc[paVar1[iVar14].hd].fast,
                                      (stbi__huffman *)psVar19->huff_ac[paVar1[iVar14].ha].fast,
                                      psVar19->fast_ac[paVar1[iVar14].ha],iVar14,
                                      psVar19->dequant[paVar1[iVar14].tq]);
                  if (iVar34 == 0) {
                    bVar42 = false;
                    goto LAB_0016d559;
                  }
                  (*psVar19->idct_block_kernel)
                            (paVar1[iVar14].data + lVar26 + iVar15 * paVar1[iVar14].w2,
                             paVar1[iVar14].w2,(short *)pal);
                  iVar34 = psVar19->todo;
                  psVar19->todo = iVar34 + -1;
                  if (iVar34 < 2) {
                    if (psVar19->code_bits < 0x18) {
                      stbi__grow_buffer_unsafe(psVar19);
                    }
                    if ((psVar19->marker & 0xf8) != 0xd0) goto LAB_0016d556;
                    stbi__jpeg_reset(psVar19);
                  }
                }
                iVar15 = iVar15 + 8;
              }
LAB_0016d556:
              bVar42 = true;
            }
            else {
              for (iVar14 = 0; iVar14 < psVar19->img_mcu_y; iVar14 = iVar14 + 1) {
                for (iVar11 = 0; iVar11 < psVar19->img_mcu_x; iVar11 = iVar11 + 1) {
                  for (lVar26 = 0; lVar26 < psVar19->scan_n; lVar26 = lVar26 + 1) {
                    iVar15 = psVar19->order[lVar26];
                    for (iVar29 = 0; iVar29 < paVar1[iVar15].v; iVar29 = iVar29 + 1) {
                      for (iVar34 = 0; iVar16 = paVar1[iVar15].h, iVar34 < iVar16;
                          iVar34 = iVar34 + 1) {
                        iVar39 = paVar1[iVar15].v;
                        iVar36 = stbi__jpeg_decode_block
                                           (psVar19,(short *)pal,
                                            (stbi__huffman *)
                                            psVar19->huff_dc[paVar1[iVar15].hd].fast,
                                            (stbi__huffman *)
                                            psVar19->huff_ac[paVar1[iVar15].ha].fast,
                                            psVar19->fast_ac[paVar1[iVar15].ha],iVar15,
                                            psVar19->dequant[paVar1[iVar15].tq]);
                        if (iVar36 == 0) {
                          bVar42 = false;
                          goto LAB_0016d559;
                        }
                        (*psVar19->idct_block_kernel)
                                  (paVar1[iVar15].data +
                                   (long)((iVar16 * iVar11 + iVar34) * 8) +
                                   (long)((iVar39 * iVar14 + iVar29) * paVar1[iVar15].w2 * 8),
                                   paVar1[iVar15].w2,(short *)pal);
                      }
                    }
                  }
                  iVar15 = psVar19->todo;
                  psVar19->todo = iVar15 + -1;
                  if (iVar15 < 2) {
                    if (psVar19->code_bits < 0x18) {
                      stbi__grow_buffer_unsafe(psVar19);
                    }
                    if ((psVar19->marker & 0xf8) != 0xd0) goto LAB_0016d5e2;
                    stbi__jpeg_reset(psVar19);
                  }
                }
              }
LAB_0016d5e2:
              bVar42 = true;
            }
LAB_0016d559:
            if (!bVar42) goto LAB_0016e297;
LAB_0016d561:
            bVar10 = psVar19->marker;
LAB_0016d568:
            if (bVar10 == 0xff) {
              while (iVar14 = stbi__at_eof(psVar19->s), iVar14 == 0) {
                sVar7 = stbi__get8(psVar19->s);
                while (sVar7 == 0xff) {
                  iVar14 = stbi__at_eof(psVar19->s);
                  if (iVar14 != 0) goto LAB_0016d5b6;
                  sVar7 = stbi__get8(psVar19->s);
                  if ((byte)(sVar7 - 1) < 0xfe) goto LAB_0016d5bb;
                }
              }
LAB_0016d5b6:
              sVar7 = 0xff;
LAB_0016d5bb:
              psVar19->marker = sVar7;
            }
            bVar10 = stbi__get_marker(psVar19);
            if ((bVar10 & 0xf8) != 0xd0) goto LAB_0016cabc;
LAB_0016cb1a:
            bVar10 = stbi__get_marker(psVar19);
            goto LAB_0016cabc;
          }
          uVar25 = (uint)bVar10;
          if (uVar25 == 0xdc) {
            iVar14 = stbi__get16be(psVar19->s);
            sVar12 = stbi__get16be(psVar19->s);
            if (iVar14 != 4) {
              stbi__g_failure_reason = "bad DNL len";
              goto LAB_0016e297;
            }
            if (sVar12 != psVar19->s->img_y) {
              stbi__g_failure_reason = "bad DNL height";
              goto LAB_0016e297;
            }
            goto LAB_0016cb1a;
          }
          if (uVar25 == 0xd9) {
            if (psVar19->progressive != 0) {
              for (lVar26 = 0; lVar26 < psVar19->s->img_n; lVar26 = lVar26 + 1) {
                uVar25 = psVar19->img_comp[lVar26].x + 7 >> 3;
                iVar14 = psVar19->img_comp[lVar26].y + 7 >> 3;
                iVar11 = 0;
                if ((int)uVar25 < 1) {
                  uVar25 = 0;
                }
                if (iVar14 < 1) {
                  iVar14 = 0;
                }
                for (; iVar11 != iVar14; iVar11 = iVar11 + 1) {
                  for (uVar30 = 0; uVar30 != uVar25; uVar30 = uVar30 + 1) {
                    psVar40 = paVar1[lVar26].coeff;
                    iVar29 = paVar1[lVar26].coeff_w * iVar11;
                    iVar15 = paVar1[lVar26].tq;
                    iVar34 = iVar29 + (int)uVar30;
                    for (lVar33 = 0; lVar33 != 0x40; lVar33 = lVar33 + 1) {
                      psVar40[iVar34 * 0x40 + lVar33] =
                           psVar40[iVar34 * 0x40 + lVar33] * psVar19->dequant[iVar15][lVar33];
                    }
                    (*psVar19->idct_block_kernel)
                              (paVar1[lVar26].data +
                               uVar30 * 8 + (long)(iVar11 * 8 * paVar1[lVar26].w2),paVar1[lVar26].w2
                               ,psVar40 + (iVar29 + (int)uVar30) * 0x40);
                  }
                }
              }
            }
          }
          else {
            iVar14 = stbi__process_marker(psVar19,uVar25);
            if (iVar14 != 0) goto LAB_0016cb1a;
          }
          psVar31 = psVar19->s;
          uVar25 = psVar31->img_n;
          uVar28 = (2 < (int)uVar25) + 1 + (uint)(2 < (int)uVar25);
          if (req_comp != 0) {
            uVar28 = req_comp;
          }
          if (uVar25 == 3) {
            bVar42 = true;
            if (psVar19->rgb != 3) {
              if (psVar19->app14_color_transform == 0) {
                bVar42 = psVar19->jfif == 0;
              }
              else {
                bVar42 = false;
              }
            }
          }
          else {
            bVar42 = false;
          }
          uVar13 = 1;
          if (bVar42) {
            uVar13 = uVar25;
          }
          if (2 < (int)uVar28) {
            uVar13 = uVar25;
          }
          if (uVar25 != 3) {
            uVar13 = uVar25;
          }
          if (0 < (int)uVar13) {
            coutput[2] = (stbi_uc *)0x0;
            coutput[3] = (stbi_uc *)0x0;
            coutput[0] = (stbi_uc *)0x0;
            coutput[1] = (stbi_uc *)0x0;
            sVar12 = psVar31->img_x;
            for (lVar26 = 0; (ulong)uVar13 * 0x30 != lVar26; lVar26 = lVar26 + 0x30) {
              pvVar18 = malloc((ulong)(sVar12 + 3));
              *(void **)((long)&psVar19->img_comp[0].linebuf + lVar26 * 2) = pvVar18;
              if (pvVar18 == (void *)0x0) {
                stbi__cleanup_jpeg(psVar19);
                goto LAB_0016e484;
              }
              uVar30 = (long)psVar19->img_h_max /
                       (long)*(int *)((long)&psVar19->img_comp[0].h + lVar26 * 2);
              iVar14 = (int)uVar30;
              *(int *)(pal[6] + lVar26) = iVar14;
              iVar11 = psVar19->img_v_max / *(int *)((long)&psVar19->img_comp[0].v + lVar26 * 2);
              *(int *)(pal[7] + lVar26) = iVar11;
              *(int *)(pal[9] + lVar26) = iVar11 >> 1;
              *(int *)(pal[8] + lVar26) =
                   (int)((ulong)(iVar14 + (sVar12 - 1)) / (uVar30 & 0xffffffff));
              psVar24 = pal[10] + lVar26;
              psVar24[0] = '\0';
              psVar24[1] = '\0';
              psVar24[2] = '\0';
              psVar24[3] = '\0';
              uVar4 = *(undefined8 *)((long)&psVar19->img_comp[0].data + lVar26 * 2);
              *(undefined8 *)(pal[4] + lVar26) = uVar4;
              *(undefined8 *)(pal[2] + lVar26) = uVar4;
              if (iVar14 == 2) {
                pcVar22 = stbi__resample_row_h_2;
                if (iVar11 != 1) {
                  if (iVar11 != 2) goto LAB_0016db25;
                  pcVar22 = psVar19->resample_row_hv_2_kernel;
                }
              }
              else if (iVar14 == 1) {
                pcVar22 = stbi__resample_row_generic;
                if (iVar11 == 2) {
                  pcVar22 = stbi__resample_row_v_2;
                }
                if (iVar11 == 1) {
                  pcVar22 = resample_row_1;
                }
              }
              else {
LAB_0016db25:
                pcVar22 = stbi__resample_row_generic;
              }
              *(code **)(pal[0] + lVar26) = pcVar22;
            }
            sVar38 = psVar31->img_y;
            psVar20 = (stbi__uint16 *)stbi__malloc_mad3(uVar28,sVar12,sVar38,1);
            if (psVar20 != (stbi__uint16 *)0x0) {
              iVar14 = 0;
              for (uVar25 = 0; uVar25 < sVar38; uVar25 = uVar25 + 1) {
                sVar12 = psVar31->img_x;
                ppsVar41 = coutput;
                for (lVar26 = 0; (ulong)uVar13 * 0x30 != lVar26; lVar26 = lVar26 + 0x30) {
                  iVar11 = *(int *)(pal[9] + lVar26);
                  iVar15 = *(int *)(pal[7] + lVar26);
                  iVar29 = iVar15 >> 1;
                  psVar24 = pal[4] + lVar26;
                  if (iVar11 < iVar29) {
                    psVar24 = pal[2] + lVar26;
                  }
                  psVar23 = pal[4] + lVar26;
                  if (iVar29 <= iVar11) {
                    psVar23 = pal[2] + lVar26;
                  }
                  psVar24 = (stbi_uc *)
                            (**(code **)(pal[0] + lVar26))
                                      (*(undefined8 *)
                                        ((long)&psVar19->img_comp[0].linebuf + lVar26 * 2),
                                       *(undefined8 *)psVar24,*(undefined8 *)psVar23,
                                       *(undefined4 *)(pal[8] + lVar26));
                  *ppsVar41 = psVar24;
                  *(int *)(pal[9] + lVar26) = iVar11 + 1;
                  if (iVar15 <= iVar11 + 1) {
                    psVar24 = pal[9] + lVar26;
                    psVar24[0] = '\0';
                    psVar24[1] = '\0';
                    psVar24[2] = '\0';
                    psVar24[3] = '\0';
                    lVar33 = *(long *)(pal[4] + lVar26);
                    *(long *)(pal[2] + lVar26) = lVar33;
                    iVar11 = *(int *)(pal[10] + lVar26) + 1;
                    *(int *)(pal[10] + lVar26) = iVar11;
                    if (iVar11 < *(int *)((long)&psVar19->img_comp[0].y + lVar26 * 2)) {
                      *(long *)(pal[4] + lVar26) =
                           lVar33 + *(int *)((long)&psVar19->img_comp[0].w2 + lVar26 * 2);
                    }
                  }
                  ppsVar41 = ppsVar41 + 1;
                }
                if ((int)uVar28 < 3) {
                  psVar31 = psVar19->s;
                  if (bVar42) {
                    if (uVar28 == 1) {
                      for (uVar30 = 0; uVar30 < psVar31->img_x; uVar30 = uVar30 + 1) {
                        *(uchar *)((long)psVar20 + uVar30 + sVar12 * iVar14) =
                             (uchar)((uint)coutput[2][uVar30] * 0x1d +
                                     (uint)coutput[1][uVar30] * 0x96 +
                                     (uint)coutput[0][uVar30] * 0x4d >> 8);
                      }
                    }
                    else {
                      for (uVar30 = 0; uVar30 < psVar31->img_x; uVar30 = uVar30 + 1) {
                        *(uchar *)((long)psVar20 + uVar30 * 2 + (ulong)(sVar12 * iVar14)) =
                             (uchar)((uint)coutput[2][uVar30] * 0x1d +
                                     (uint)coutput[1][uVar30] * 0x96 +
                                     (uint)coutput[0][uVar30] * 0x4d >> 8);
                        *(uchar *)((long)psVar20 + uVar30 * 2 + (ulong)(sVar12 * iVar14) + 1) = 0xff
                        ;
                      }
                    }
                  }
                  else if (psVar31->img_n == 4) {
                    if (psVar19->app14_color_transform == 2) {
                      puVar21 = (uchar *)((long)psVar20 + (ulong)(sVar12 * iVar14) + 1);
                      for (uVar30 = 0; uVar30 < psVar31->img_x; uVar30 = uVar30 + 1) {
                        iVar11 = (coutput[0][uVar30] ^ 0xff) * (uint)coutput[3][uVar30];
                        puVar21[-1] = (uchar)((iVar11 + 0x80U >> 8) + iVar11 + 0x80 >> 8);
                        *puVar21 = 0xff;
                        puVar21 = puVar21 + uVar28;
                      }
                    }
                    else {
                      if (psVar19->app14_color_transform != 0) goto LAB_0016e0df;
                      puVar21 = (uchar *)((long)psVar20 + (ulong)(sVar12 * iVar14) + 1);
                      for (uVar30 = 0; uVar30 < psVar31->img_x; uVar30 = uVar30 + 1) {
                        bVar10 = coutput[3][uVar30];
                        iVar11 = (uint)coutput[0][uVar30] * (uint)bVar10;
                        iVar15 = (uint)coutput[1][uVar30] * (uint)bVar10;
                        puVar21[-1] = (uchar)((((uint)coutput[2][uVar30] * (uint)bVar10 + 0x80 >> 8)
                                               + (uint)coutput[2][uVar30] * (uint)bVar10 + 0x80 >> 8
                                              ) * 0x1d +
                                              (iVar15 + (iVar15 + 0x80U >> 8) + 0x80 >> 8) * 0x96 +
                                              (iVar11 + (iVar11 + 0x80U >> 8) + 0x80 >> 8) * 0x4d >>
                                             8);
                        *puVar21 = 0xff;
                        puVar21 = puVar21 + uVar28;
                      }
                    }
                  }
                  else {
LAB_0016e0df:
                    if (uVar28 == 1) {
                      for (uVar30 = 0; uVar30 < psVar31->img_x; uVar30 = uVar30 + 1) {
                        *(stbi_uc *)((long)psVar20 + uVar30 + sVar12 * iVar14) = coutput[0][uVar30];
                      }
                    }
                    else {
                      for (uVar30 = 0; uVar30 < psVar31->img_x; uVar30 = uVar30 + 1) {
                        *(stbi_uc *)((long)psVar20 + uVar30 * 2 + (ulong)(sVar12 * iVar14)) =
                             coutput[0][uVar30];
                        *(uchar *)((long)psVar20 + uVar30 * 2 + (ulong)(sVar12 * iVar14) + 1) = 0xff
                        ;
                      }
                    }
                  }
                }
                else {
                  psVar24 = (stbi_uc *)((ulong)(uVar25 * uVar28 * sVar12) + (long)psVar20);
                  psVar31 = psVar19->s;
                  if (psVar31->img_n == 3) {
                    if (bVar42) {
                      puVar21 = (uchar *)((long)psVar20 + (ulong)(sVar12 * iVar14) + 3);
                      for (uVar30 = 0; uVar30 < psVar31->img_x; uVar30 = uVar30 + 1) {
                        puVar21[-3] = coutput[0][uVar30];
                        puVar21[-2] = coutput[1][uVar30];
                        puVar21[-1] = coutput[2][uVar30];
                        *puVar21 = 0xff;
                        puVar21 = puVar21 + uVar28;
                      }
                    }
                    else {
LAB_0016e118:
                      (*psVar19->YCbCr_to_RGB_kernel)
                                (psVar24,coutput[0],coutput[1],coutput[2],psVar31->img_x,uVar28);
                    }
                  }
                  else if (psVar31->img_n == 4) {
                    if (psVar19->app14_color_transform == 2) {
                      (*psVar19->YCbCr_to_RGB_kernel)
                                (psVar24,coutput[0],coutput[1],coutput[2],psVar31->img_x,uVar28);
                      psVar31 = psVar19->s;
                      pbVar32 = (byte *)((long)psVar20 + (ulong)(sVar12 * iVar14) + 2);
                      for (uVar30 = 0; uVar30 < psVar31->img_x; uVar30 = uVar30 + 1) {
                        bVar10 = coutput[3][uVar30];
                        iVar11 = (pbVar32[-2] ^ 0xff) * (uint)bVar10;
                        pbVar32[-2] = (byte)((iVar11 + 0x80U >> 8) + iVar11 + 0x80 >> 8);
                        iVar11 = (pbVar32[-1] ^ 0xff) * (uint)bVar10;
                        pbVar32[-1] = (byte)((iVar11 + 0x80U >> 8) + iVar11 + 0x80 >> 8);
                        iVar11 = (*pbVar32 ^ 0xff) * (uint)bVar10;
                        *pbVar32 = (byte)((iVar11 + 0x80U >> 8) + iVar11 + 0x80 >> 8);
                        pbVar32 = pbVar32 + uVar28;
                      }
                    }
                    else {
                      if (psVar19->app14_color_transform != 0) goto LAB_0016e118;
                      puVar21 = (uchar *)((long)psVar20 + (ulong)(sVar12 * iVar14) + 3);
                      for (uVar30 = 0; uVar30 < psVar31->img_x; uVar30 = uVar30 + 1) {
                        bVar10 = coutput[3][uVar30];
                        iVar11 = (uint)coutput[0][uVar30] * (uint)bVar10;
                        puVar21[-3] = (uchar)((iVar11 + 0x80U >> 8) + iVar11 + 0x80 >> 8);
                        iVar11 = (uint)coutput[1][uVar30] * (uint)bVar10;
                        puVar21[-2] = (uchar)((iVar11 + 0x80U >> 8) + iVar11 + 0x80 >> 8);
                        puVar21[-1] = (uchar)(((uint)coutput[2][uVar30] * (uint)bVar10 + 0x80 >> 8)
                                              + (uint)coutput[2][uVar30] * (uint)bVar10 + 0x80 >> 8)
                        ;
                        *puVar21 = 0xff;
                        puVar21 = puVar21 + uVar28;
                      }
                    }
                  }
                  else {
                    puVar21 = (uchar *)((long)psVar20 + (ulong)(sVar12 * iVar14) + 3);
                    for (uVar30 = 0; uVar30 < psVar31->img_x; uVar30 = uVar30 + 1) {
                      uVar2 = coutput[0][uVar30];
                      puVar21[-1] = uVar2;
                      puVar21[-2] = uVar2;
                      puVar21[-3] = uVar2;
                      *puVar21 = 0xff;
                      puVar21 = puVar21 + uVar28;
                    }
                  }
                }
                psVar31 = psVar19->s;
                sVar38 = psVar31->img_y;
                iVar14 = iVar14 + uVar28;
              }
              stbi__cleanup_jpeg(psVar19);
              psVar31 = psVar19->s;
              *x = psVar31->img_x;
              *y = psVar31->img_y;
              if (comp != (int *)0x0) {
                *comp = (uint)(2 < psVar31->img_n) * 2 + 1;
              }
              goto LAB_0016e2a7;
            }
            stbi__cleanup_jpeg(psVar19);
LAB_0016e484:
            stbi__g_failure_reason = "outofmem";
            goto LAB_0016e2a4;
          }
        }
LAB_0016e297:
        stbi__cleanup_jpeg(psVar19);
      }
      else {
        stbi__g_failure_reason = "bad req_comp";
      }
LAB_0016e2a4:
      psVar20 = (stbi__uint16 *)0x0;
LAB_0016e2a7:
      free(psVar19);
      return psVar20;
    }
  }
  sVar7 = stbi__get8(s);
  sVar8 = stbi__get8(s);
  if ((sVar7 != 'P') || ((byte)(sVar8 - 0x37) < 0xfe)) {
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    stbi__g_failure_reason = "unknown image type";
    return (void *)0x0;
  }
  y_00 = &s->img_y;
  comp_00 = &s->img_n;
  iVar11 = stbi__pnm_info(s,(int *)s,(int *)y_00,comp_00);
  ri->bits_per_channel = iVar11;
  if (iVar11 == 0) {
    return (void *)0x0;
  }
  if ((*y_00 < 0x1000001) && (s->img_x < 0x1000001)) {
    *x = s->img_x;
    sVar12 = *y_00;
    *y = sVar12;
    iVar11 = *comp_00;
    if (comp != (int *)0x0) {
      *comp = iVar11;
      sVar12 = *y_00;
    }
    sVar38 = s->img_x;
    iVar15 = ri->bits_per_channel / 8;
    iVar29 = stbi__mad4sizes_valid(iVar11,sVar38,sVar12,iVar15,iVar14);
    if (iVar29 != 0) {
      psVar20 = (stbi__uint16 *)stbi__malloc_mad4(iVar11,sVar38,sVar12,iVar15,iVar14);
      if (psVar20 != (stbi__uint16 *)0x0) {
        iVar14 = stbi__getn(s,(stbi_uc *)psVar20,sVar12 * iVar11 * sVar38 * iVar15);
        if (iVar14 == 0) {
          free(psVar20);
          stbi__g_failure_reason = "bad PNM";
          return (void *)0x0;
        }
        if (req_comp == 0) {
          return psVar20;
        }
        iVar14 = *comp_00;
        if (iVar14 == req_comp) {
          return psVar20;
        }
        if (ri->bits_per_channel == 0x10) {
          psVar20 = stbi__convert_format16(psVar20,iVar14,req_comp,s->img_x,s->img_y);
          return psVar20;
        }
        puVar21 = stbi__convert_format((uchar *)psVar20,iVar14,req_comp,s->img_x,s->img_y);
        return puVar21;
      }
LAB_0016d732:
      stbi__g_failure_reason = "outofmem";
      return (void *)0x0;
    }
  }
LAB_0016d729:
  stbi__g_failure_reason = "too large";
  return (void *)0x0;
LAB_0016d9dc:
  stbi__g_failure_reason = "bad huffman code";
  goto LAB_0016e297;
LAB_0016db83:
  stbi__g_failure_reason = "bad huffman code";
  goto LAB_0016e297;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   // test the formats with a very explicit header first (at least a FOURCC
   // or distinctive magic number first)
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif

   // then the formats that can end up attempting to load with just 1 or 2
   // bytes matching expectations; these are prone to false positives, so
   // try them later
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}